

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

bool __thiscall
gguf_reader::read<short>(gguf_reader *this,vector<short,_std::allocator<short>_> *dst,size_t n)

{
  size_t sVar1;
  pointer psVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  std::vector<short,_std::allocator<short>_>::resize(dst,n);
  psVar2 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_finish == psVar2) {
    bVar5 = true;
  }
  else {
    lVar4 = 0;
    uVar3 = 0;
    do {
      sVar1 = fread((void *)((long)psVar2 + lVar4),1,2,(FILE *)this->file);
      bVar5 = sVar1 == 2;
      if (!bVar5) {
        return bVar5;
      }
      uVar3 = uVar3 + 1;
      psVar2 = (dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 2;
    } while (uVar3 < (ulong)((long)(dst->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)psVar2 >> 1));
  }
  return bVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }